

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextengine_p.h
# Opt level: O0

QGlyphLayout * __thiscall QGlyphLayout::mid(QGlyphLayout *this,int position,int n)

{
  int in_ECX;
  int in_EDX;
  void *in_RSI;
  QGlyphLayout *in_RDI;
  QGlyphLayout *copy;
  
  memset(in_RDI,0xaa,0x30);
  memcpy(in_RDI,in_RSI,0x30);
  in_RDI->glyphs = in_RDI->glyphs + in_EDX;
  in_RDI->advances = in_RDI->advances + in_EDX;
  in_RDI->offsets = in_RDI->offsets + in_EDX;
  in_RDI->justifications = in_RDI->justifications + (long)in_EDX * 4;
  in_RDI->attributes = in_RDI->attributes + in_EDX;
  if (in_ECX == -1) {
    in_RDI->numGlyphs = in_RDI->numGlyphs - in_EDX;
  }
  else {
    in_RDI->numGlyphs = in_ECX;
  }
  return in_RDI;
}

Assistant:

inline QGlyphLayout mid(int position, int n = -1) const {
        QGlyphLayout copy = *this;
        copy.glyphs += position;
        copy.advances += position;
        copy.offsets += position;
        copy.justifications += position;
        copy.attributes += position;
        if (n == -1)
            copy.numGlyphs -= position;
        else
            copy.numGlyphs = n;
        return copy;
    }